

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeakFinder.cpp
# Opt level: O1

void scalarProduct(float scalar,vector<float,_std::allocator<float>_> *in,
                  vector<float,_std::allocator<float>_> *out)

{
  pointer pfVar1;
  pointer pfVar2;
  long lVar3;
  long lVar4;
  allocator_type local_35;
  float local_34;
  vector<float,_std::allocator<float>_> local_30;
  
  local_34 = scalar;
  std::vector<float,_std::allocator<float>_>::vector
            (&local_30,
             (long)(in->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(in->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 2,&local_35);
  std::vector<float,_std::allocator<float>_>::_M_move_assign(out);
  if (local_30.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_30.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  pfVar1 = (in->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  lVar3 = (long)(in->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pfVar1;
  if (lVar3 != 0) {
    lVar3 = lVar3 >> 2;
    pfVar2 = (out->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar4 = 0;
    do {
      pfVar2[lVar4] = pfVar1[lVar4] * local_34;
      lVar4 = lVar4 + 1;
    } while (lVar3 + (ulong)(lVar3 == 0) != lVar4);
  }
  return;
}

Assistant:

void scalarProduct(float scalar, std::vector<float> in, std::vector<float>& out)
{
	out = std::vector<float>(in.size());

	for(int i=0; i<in.size(); ++i)
		out[i] = scalar * in[i];
}